

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void liveness_pass_1(TCGContext_conflict9 *s)

{
  int ng;
  int nt;
  int iVar1;
  TCGRegSet TVar2;
  TCGOp *pTVar3;
  TCGOpDef *pTVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  TCGTemp *pTVar9;
  TCGRegSet *pTVar10;
  TCGArgConstraint *pTVar11;
  anon_union_4_1_8991075d_for_u *paVar12;
  uint local_98;
  TCGRegSet local_8c;
  TCGRegSet *pset;
  TCGRegSet set;
  TCGArgConstraint *ct;
  int nb_call_regs;
  int call_flags;
  TCGOpDef *def;
  TCGOpcode opc;
  TCGTemp *ts;
  TCGLifeData arg_life;
  _Bool have_opc_new2;
  TCGOpcode opc_new2;
  TCGOpcode opc_new;
  int nb_oargs;
  int nb_iargs;
  int i;
  TCGRegSet *prefs;
  TCGOp *op_prev;
  TCGOp *op;
  int nb_temps;
  int nb_globals;
  TCGContext_conflict9 *s_local;
  
  ng = s->nb_globals;
  nt = s->nb_temps;
  pvVar8 = tcg_malloc(s,nt << 2);
  for (nb_oargs = 0; nb_oargs < nt; nb_oargs = nb_oargs + 1) {
    s->temps[nb_oargs].state_ptr = (void *)((long)pvVar8 + (long)nb_oargs * 4);
  }
  la_func_end(s,ng,nt);
  op_prev = (TCGOp *)((s->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
  do {
    if (op_prev == (TCGOp *)0x0) {
      return;
    }
    pTVar3 = (TCGOp *)((op_prev->link).tqe_circ.tql_prev)->tql_prev->tql_next;
    ts._0_2_ = 0;
    uVar6 = (uint)*(byte *)op_prev;
    pTVar4 = s->tcg_op_defs;
    if (uVar6 == 0) {
      pTVar9 = arg_temp(op_prev->args[0]);
      pTVar9->state = 1;
      la_reset_pref(s,pTVar9);
    }
    else if (uVar6 == 2) {
      uVar6 = *(uint *)op_prev >> 0xc & 0xf;
      uVar7 = *(uint *)op_prev >> 8 & 0xf;
      uVar5 = op_prev->args[(int)(uVar6 + uVar7 + 1)];
      if ((uVar5 & 4) == 0) {
LAB_012d6472:
        for (nb_oargs = 0; nb_oargs < (int)uVar6; nb_oargs = nb_oargs + 1) {
          pTVar9 = arg_temp(op_prev->args[nb_oargs]);
          if ((pTVar9->state & 1) != 0) {
            ts._0_2_ = (ushort)ts | (ushort)(4 << ((byte)nb_oargs & 0x1f));
          }
          if ((pTVar9->state & 2) != 0) {
            ts._0_2_ = (ushort)ts | (ushort)(1 << ((byte)nb_oargs & 0x1f));
          }
          pTVar9->state = 1;
          la_reset_pref(s,pTVar9);
          op_prev->output_pref[nb_oargs] = 0;
        }
        nb_oargs = uVar6;
        if ((uVar5 & 3) == 0) {
          la_global_kill(s,ng);
        }
        else if ((uVar5 & 1) == 0) {
          la_global_sync(s,ng);
        }
        for (; nb_oargs < (int)(uVar7 + uVar6); nb_oargs = nb_oargs + 1) {
          pTVar9 = arg_temp(op_prev->args[nb_oargs]);
          if ((pTVar9 != (TCGTemp *)0x0) && ((pTVar9->state & 1) != 0)) {
            ts._0_2_ = (ushort)ts | (ushort)(4 << ((byte)nb_oargs & 0x1f));
          }
        }
        la_cross_call(s,nt);
        for (nb_oargs = 0; nb_oargs < (int)uVar7; nb_oargs = nb_oargs + 1) {
          pTVar9 = arg_temp(op_prev->args[(int)(nb_oargs + uVar6)]);
          if ((pTVar9 != (TCGTemp *)0x0) && ((pTVar9->state & 1) != 0)) {
            if (nb_oargs < 6) {
              local_8c = 0;
            }
            else {
              local_8c = s->tcg_target_available_regs
                         [(uint)((ulong)*(undefined8 *)pTVar9 >> 0x18) & 0xff];
            }
            pTVar10 = la_temp_pref(pTVar9);
            *pTVar10 = local_8c;
            pTVar9->state = pTVar9->state & 0xfffffffffffffffe;
          }
        }
        nb_oargs = 0;
        while( true ) {
          local_98 = uVar7;
          if (6 < uVar7) {
            local_98 = 6;
          }
          if ((int)local_98 <= nb_oargs) break;
          pTVar9 = arg_temp(op_prev->args[(int)(nb_oargs + uVar6)]);
          if (pTVar9 != (TCGTemp *)0x0) {
            iVar1 = tcg_target_call_iarg_regs[nb_oargs];
            pTVar10 = la_temp_pref(pTVar9);
            *pTVar10 = 1 << ((byte)iVar1 & 0x1f) | *pTVar10;
          }
          nb_oargs = nb_oargs + 1;
        }
        goto LAB_012d6d19;
      }
      for (nb_oargs = 0; nb_oargs < (int)uVar6; nb_oargs = nb_oargs + 1) {
        pTVar9 = arg_temp(op_prev->args[nb_oargs]);
        if (pTVar9->state != 1) goto LAB_012d6472;
      }
LAB_012d69ae:
      tcg_op_remove_tricore(s,op_prev);
    }
    else {
      def._4_4_ = uVar6;
      if (uVar6 == 0x27) {
        _arg_life = 0x11;
LAB_012d677e:
        opc_new = INDEX_op_mb;
        opc_new2 = INDEX_op_call;
        pTVar9 = arg_temp(op_prev->args[1]);
        if (pTVar9->state == 1) {
          pTVar9 = arg_temp(op_prev->args[0]);
          if (pTVar9->state == 1) goto LAB_012d69ae;
          def._4_4_ = _arg_life;
          *(uint *)op_prev = *(uint *)op_prev & 0xffffff00 | _arg_life;
          op_prev->args[1] = op_prev->args[2];
          op_prev->args[2] = op_prev->args[4];
          opc_new = INDEX_op_call;
          opc_new2 = INDEX_op_set_label;
        }
      }
      else {
        if (uVar6 == 0x28) {
          _arg_life = 0x12;
          goto LAB_012d677e;
        }
        if (uVar6 == 0x29) {
          _arg_life = 0x13;
LAB_012d6856:
          opc_new = INDEX_op_call;
          opc_new2 = INDEX_op_call;
          pTVar9 = arg_temp(op_prev->args[1]);
          if (pTVar9->state == 1) {
            pTVar9 = arg_temp(op_prev->args[0]);
            if (pTVar9->state == 1) goto LAB_012d69ae;
            *(uint *)op_prev = *(uint *)op_prev & 0xffffff00 | _arg_life;
            op_prev->args[1] = op_prev->args[2];
            op_prev->args[2] = op_prev->args[3];
            def._4_4_ = _arg_life;
            opc_new2 = INDEX_op_set_label;
          }
          else {
            arg_temp(op_prev->args[0]);
          }
        }
        else {
          if (uVar6 == 0x2a) {
            _arg_life = 0x13;
            goto LAB_012d6856;
          }
          if (uVar6 == 0x7b) {
            _arg_life = 0x4e;
            goto LAB_012d677e;
          }
          if (uVar6 == 0x7c) {
            _arg_life = 0x4f;
            goto LAB_012d677e;
          }
          if (uVar6 == 0x7d) {
            _arg_life = 0x50;
            goto LAB_012d6856;
          }
          if (uVar6 == 0x7e) {
            _arg_life = 0x50;
            goto LAB_012d6856;
          }
          if (uVar6 == 0x81) goto LAB_012d6d19;
          opc_new = (TCGOpcode)pTVar4[uVar6].nb_iargs;
          opc_new2 = (TCGOpcode)pTVar4[uVar6].nb_oargs;
          if (((pTVar4[uVar6].flags & 8) == 0) && (opc_new2 != INDEX_op_discard)) {
            for (nb_oargs = 0; nb_oargs < (int)opc_new2; nb_oargs = nb_oargs + 1) {
              pTVar9 = arg_temp(op_prev->args[nb_oargs]);
              if (pTVar9->state != 1) goto LAB_012d69c0;
            }
            goto LAB_012d69ae;
          }
        }
      }
LAB_012d69c0:
      for (nb_oargs = 0; nb_oargs < (int)opc_new2; nb_oargs = nb_oargs + 1) {
        pTVar9 = arg_temp(op_prev->args[nb_oargs]);
        pTVar10 = la_temp_pref(pTVar9);
        op_prev->output_pref[nb_oargs] = *pTVar10;
        if ((pTVar9->state & 1) != 0) {
          ts._0_2_ = (ushort)ts | (ushort)(4 << ((byte)nb_oargs & 0x1f));
        }
        if ((pTVar9->state & 2) != 0) {
          ts._0_2_ = (ushort)ts | (ushort)(1 << ((byte)nb_oargs & 0x1f));
        }
        pTVar9->state = 1;
        la_reset_pref(s,pTVar9);
      }
      if ((pTVar4[uVar6].flags & 1) == 0) {
        if ((pTVar4[uVar6].flags & 2) == 0) {
          if (((pTVar4[uVar6].flags & 8) != 0) &&
             (la_global_sync(s,ng), (pTVar4[uVar6].flags & 4) != 0)) {
            la_cross_call(s,nt);
          }
        }
        else if (def._4_4_ == 0x26) {
          la_brcond_end(s,ng);
        }
        else {
          la_bb_end(s,ng,nt);
        }
      }
      else {
        la_func_end(s,ng,nt);
      }
      for (nb_oargs = opc_new2; nb_oargs < (int)(opc_new2 + opc_new); nb_oargs = nb_oargs + 1) {
        pTVar9 = arg_temp(op_prev->args[nb_oargs]);
        if ((pTVar9->state & 1) != 0) {
          ts._0_2_ = (ushort)ts | (ushort)(4 << ((byte)nb_oargs & 0x1f));
        }
      }
      for (nb_oargs = opc_new2; nb_oargs < (int)(opc_new2 + opc_new); nb_oargs = nb_oargs + 1) {
        pTVar9 = arg_temp(op_prev->args[nb_oargs]);
        if ((pTVar9->state & 1) != 0) {
          TVar2 = s->tcg_target_available_regs[(uint)((ulong)*(undefined8 *)pTVar9 >> 0x18) & 0xff];
          pTVar10 = la_temp_pref(pTVar9);
          *pTVar10 = TVar2;
          pTVar9->state = pTVar9->state & 0xfffffffffffffffe;
        }
      }
      if ((def._4_4_ == 5) || (def._4_4_ == 0x3f)) {
        if (((ushort)ts & 8) != 0) {
          pTVar9 = arg_temp(op_prev->args[1]);
          pTVar10 = la_temp_pref(pTVar9);
          TVar2 = *pTVar10;
          pTVar9 = arg_temp(op_prev->args[0]);
          pTVar10 = la_temp_pref(pTVar9);
          *pTVar10 = TVar2;
        }
      }
      else {
        for (nb_oargs = opc_new2; nb_oargs < (int)(opc_new2 + opc_new); nb_oargs = nb_oargs + 1) {
          pTVar11 = pTVar4[uVar6].args_ct + nb_oargs;
          pTVar9 = arg_temp(op_prev->args[nb_oargs]);
          paVar12 = (anon_union_4_1_8991075d_for_u *)la_temp_pref(pTVar9);
          pset._4_4_ = (pTVar11->u).regs & paVar12->regs;
          if ((pTVar11->ct & 0x40) != 0) {
            pset._4_4_ = op_prev->output_pref[pTVar11->alias_index] & pset._4_4_;
          }
          if (pset._4_4_ == 0) {
            pset._4_4_ = pTVar11->u;
          }
          paVar12->regs = (TCGRegSet)pset._4_4_;
        }
      }
    }
LAB_012d6d19:
    *(uint *)op_prev = *(uint *)op_prev & 0xffff | (uint)(ushort)ts << 0x10;
    op_prev = pTVar3;
  } while( true );
}

Assistant:

static void liveness_pass_1(TCGContext *s)
{
    int nb_globals = s->nb_globals;
    int nb_temps = s->nb_temps;
    TCGOp *op, *op_prev;
    TCGRegSet *prefs;
    int i;

    prefs = tcg_malloc(s, sizeof(TCGRegSet) * nb_temps);
    for (i = 0; i < nb_temps; ++i) {
        s->temps[i].state_ptr = prefs + i;
    }

    /* ??? Should be redundant with the exit_tb that ends the TB.  */
    la_func_end(s, nb_globals, nb_temps);

    QTAILQ_FOREACH_REVERSE_SAFE(op, &s->ops, link, op_prev) {
        int nb_iargs, nb_oargs;
        TCGOpcode opc_new, opc_new2;
        bool have_opc_new2;
        TCGLifeData arg_life = 0;
        TCGTemp *ts;
        TCGOpcode opc = op->opc;
        const TCGOpDef *def = &s->tcg_op_defs[opc];

        switch (opc) {
        case INDEX_op_call:
            {
                int call_flags;
                int nb_call_regs;

                nb_oargs = TCGOP_CALLO(op);
                nb_iargs = TCGOP_CALLI(op);
                call_flags = op->args[nb_oargs + nb_iargs + 1];

                /* pure functions can be removed if their result is unused */
                if (call_flags & TCG_CALL_NO_SIDE_EFFECTS) {
                    for (i = 0; i < nb_oargs; i++) {
                        ts = arg_temp(op->args[i]);
                        if (ts->state != TS_DEAD) {
                            goto do_not_remove_call;
                        }
                    }
                    goto do_remove;
                }
            do_not_remove_call:

                /* Output args are dead.  */
                for (i = 0; i < nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                    if (ts->state & TS_MEM) {
                        arg_life |= SYNC_ARG << i;
                    }
                    ts->state = TS_DEAD;
                    la_reset_pref(s, ts);

                    /* Not used -- it will be tcg_target_call_oarg_regs[i].  */
                    op->output_pref[i] = 0;
                }

                if (!(call_flags & (TCG_CALL_NO_WRITE_GLOBALS |
                                    TCG_CALL_NO_READ_GLOBALS))) {
                    la_global_kill(s, nb_globals);
                } else if (!(call_flags & TCG_CALL_NO_READ_GLOBALS)) {
                    la_global_sync(s, nb_globals);
                }

                /* Record arguments that die in this helper.  */
                for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
                    ts = arg_temp(op->args[i]);
                    if (ts && ts->state & TS_DEAD) {
                        arg_life |= DEAD_ARG << i;
                    }
                }

                /* For all live registers, remove call-clobbered prefs.  */
                la_cross_call(s, nb_temps);

                nb_call_regs = ARRAY_SIZE(tcg_target_call_iarg_regs);

                /* Input arguments are live for preceding opcodes.  */
                for (i = 0; i < nb_iargs; i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts && ts->state & TS_DEAD) {
                        /* For those arguments that die, and will be allocated
                         * in registers, clear the register set for that arg,
                         * to be filled in below.  For args that will be on
                         * the stack, reset to any available reg.
                         */
                        *la_temp_pref(ts)
                            = (i < nb_call_regs ? 0 :
                               s->tcg_target_available_regs[ts->type]);
                        ts->state &= ~TS_DEAD;
                    }
                }

                /* For each input argument, add its input register to prefs.
                   If a temp is used once, this produces a single set bit.  */
                for (i = 0; i < MIN(nb_call_regs, nb_iargs); i++) {
                    ts = arg_temp(op->args[i + nb_oargs]);
                    if (ts) {
                        tcg_regset_set_reg(*la_temp_pref(ts),
                                           tcg_target_call_iarg_regs[i]);
                    }
                }
            }
            break;
        case INDEX_op_insn_start:
            break;
        case INDEX_op_discard:
            /* mark the temporary as dead */
            ts = arg_temp(op->args[0]);
            ts->state = TS_DEAD;
            la_reset_pref(s, ts);
            break;

        case INDEX_op_add2_i32:
            opc_new = INDEX_op_add_i32;
            goto do_addsub2;
        case INDEX_op_sub2_i32:
            opc_new = INDEX_op_sub_i32;
            goto do_addsub2;
        case INDEX_op_add2_i64:
            opc_new = INDEX_op_add_i64;
            goto do_addsub2;
        case INDEX_op_sub2_i64:
            opc_new = INDEX_op_sub_i64;
        do_addsub2:
            nb_iargs = 4;
            nb_oargs = 2;
            /* Test if the high part of the operation is dead, but not
               the low part.  The result can be optimized to a simple
               add or sub.  This happens often for x86_64 guest when the
               cpu mode is set to 32 bit.  */
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    goto do_remove;
                }
                /* Replace the opcode and adjust the args in place,
                   leaving 3 unused args at the end.  */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[4];
                /* Fall through and mark the single-word operation live.  */
                nb_iargs = 2;
                nb_oargs = 1;
            }
            goto do_not_remove;

        case INDEX_op_mulu2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_muluh_i32;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i32;
            goto do_mul2;
        case INDEX_op_muls2_i32:
            opc_new = INDEX_op_mul_i32;
            opc_new2 = INDEX_op_mulsh_i32;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i32;
            goto do_mul2;
        case INDEX_op_mulu2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_muluh_i64;
            have_opc_new2 = TCG_TARGET_HAS_muluh_i64;
            goto do_mul2;
        case INDEX_op_muls2_i64:
            opc_new = INDEX_op_mul_i64;
            opc_new2 = INDEX_op_mulsh_i64;
            have_opc_new2 = TCG_TARGET_HAS_mulsh_i64;
            goto do_mul2;
        do_mul2:
            nb_iargs = 2;
            nb_oargs = 2;
            if (arg_temp(op->args[1])->state == TS_DEAD) {
                if (arg_temp(op->args[0])->state == TS_DEAD) {
                    /* Both parts of the operation are dead.  */
                    goto do_remove;
                }
                /* The high part of the operation is dead; generate the low. */
                op->opc = opc = opc_new;
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else if (arg_temp(op->args[0])->state == TS_DEAD && have_opc_new2) {
                /* The low part of the operation is dead; generate the high. */
                op->opc = opc = opc_new2;
                op->args[0] = op->args[1];
                op->args[1] = op->args[2];
                op->args[2] = op->args[3];
            } else {
                goto do_not_remove;
            }
            /* Mark the single-word operation live.  */
            nb_oargs = 1;
            goto do_not_remove;

        default:
            /* XXX: optimize by hardcoding common cases (e.g. triadic ops) */
            nb_iargs = def->nb_iargs;
            nb_oargs = def->nb_oargs;

            /* Test if the operation can be removed because all
               its outputs are dead. We assume that nb_oargs == 0
               implies side effects */
            if (!(def->flags & TCG_OPF_SIDE_EFFECTS) && nb_oargs != 0) {
                for (i = 0; i < nb_oargs; i++) {
                    if (arg_temp(op->args[i])->state != TS_DEAD) {
                        goto do_not_remove;
                    }
                }
                goto do_remove;
            }
            goto do_not_remove;

        do_remove:
            tcg_op_remove(s, op);
            break;

        do_not_remove:
            for (i = 0; i < nb_oargs; i++) {
                ts = arg_temp(op->args[i]);

                /* Remember the preference of the uses that followed.  */
                op->output_pref[i] = *la_temp_pref(ts);

                /* Output args are dead.  */
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
                if (ts->state & TS_MEM) {
                    arg_life |= SYNC_ARG << i;
                }
                ts->state = TS_DEAD;
                la_reset_pref(s, ts);
            }

            /* If end of basic block, update.  */
            if (def->flags & TCG_OPF_BB_EXIT) {
                la_func_end(s, nb_globals, nb_temps);
            } else if (def->flags & TCG_OPF_BB_END) {
                // Unicorn: do not optimize dead temps on brcond,
                // this causes problem because check_exit_request() inserts
                // brcond instruction in the middle of the TB,
                // which incorrectly flags end-of-block
                if (opc != INDEX_op_brcond_i32) {
                    la_bb_end(s, nb_globals, nb_temps);
                } else {
                    // Unicorn: we do not touch dead temps for brcond,
                    // but we should refresh TCG globals In-Memory states,
                    // otherwise, important CPU states(especially conditional flags) might be forgotten,
                    // result in wrongly generated host code that run into wrong branch.
                    // Refer to https://github.com/unicorn-engine/unicorn/issues/287 for further information
                    la_brcond_end(s, nb_globals);
                }
            } else if (def->flags & TCG_OPF_SIDE_EFFECTS) {
                la_global_sync(s, nb_globals);
                if (def->flags & TCG_OPF_CALL_CLOBBER) {
                    la_cross_call(s, nb_temps);
                }
            }

            /* Record arguments that die in this opcode.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    arg_life |= DEAD_ARG << i;
                }
            }

            /* Input arguments are live for preceding opcodes.  */
            for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                ts = arg_temp(op->args[i]);
                if (ts->state & TS_DEAD) {
                    /* For operands that were dead, initially allow
                       all regs for the type.  */
                    *la_temp_pref(ts) = s->tcg_target_available_regs[ts->type];
                    ts->state &= ~TS_DEAD;
                }
            }

            /* Incorporate constraints for this operand.  */
            switch (opc) {
            case INDEX_op_mov_i32:
            case INDEX_op_mov_i64:
                /* Note that these are TCG_OPF_NOT_PRESENT and do not
                   have proper constraints.  That said, special case
                   moves to propagate preferences backward.  */
                if (IS_DEAD_ARG(1)) {
                    *la_temp_pref(arg_temp(op->args[0]))
                        = *la_temp_pref(arg_temp(op->args[1]));
                }
                break;

            default:
                for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
                    const TCGArgConstraint *ct = &def->args_ct[i];
                    TCGRegSet set, *pset;

                    ts = arg_temp(op->args[i]);
                    pset = la_temp_pref(ts);
                    set = *pset;

                    set &= ct->u.regs;
                    if (ct->ct & TCG_CT_IALIAS) {
                        set &= op->output_pref[ct->alias_index];
                    }
                    /* If the combination is not possible, restart.  */
                    if (set == 0) {
                        set = ct->u.regs;
                    }
                    *pset = set;
                }
                break;
            }
            break;
        }
        op->life = arg_life;
    }
}